

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * sqlite3_get_auxdata(sqlite3_context *pCtx,int iArg)

{
  AuxData *pAVar1;
  AuxData **ppAVar2;
  
  if (pCtx->pVdbe != (Vdbe *)0x0) {
    ppAVar2 = &pCtx->pVdbe->pAuxData;
    while (pAVar1 = *ppAVar2, pAVar1 != (AuxData *)0x0) {
      if ((pAVar1->iAuxArg == iArg) && ((iArg < 0 || (pAVar1->iAuxOp == pCtx->iOp)))) {
        return pAVar1->pAux;
      }
      ppAVar2 = &pAVar1->pNextAux;
    }
  }
  return (void *)0x0;
}

Assistant:

SQLITE_API void *sqlite3_get_auxdata(sqlite3_context *pCtx, int iArg){
  AuxData *pAuxData;

  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
#if SQLITE_ENABLE_STAT3_OR_STAT4
  if( pCtx->pVdbe==0 ) return 0;
#else
  assert( pCtx->pVdbe!=0 );
#endif
  for(pAuxData=pCtx->pVdbe->pAuxData; pAuxData; pAuxData=pAuxData->pNextAux){
    if(  pAuxData->iAuxArg==iArg && (pAuxData->iAuxOp==pCtx->iOp || iArg<0) ){
      return pAuxData->pAux;
    }
  }
  return 0;
}